

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_influence.h
# Opt level: O0

void __thiscall
xray_re::_influence<unsigned_int,_float>::set
          (_influence<unsigned_int,_float> *this,size_t num_bones,uint16_t *bones,float *weights)

{
  iterator p_Var1;
  float *pfVar2;
  iterator last;
  iterator it;
  _bone_weight<unsigned_int,_float> bw;
  float w;
  float sum;
  float *weights_local;
  uint16_t *bones_local;
  size_t num_bones_local;
  _influence<unsigned_int,_float> *this_local;
  
  bw.weight = 0.0;
  _w = weights;
  weights_local = (float *)bones;
  bones_local = (uint16_t *)num_bones;
LAB_001c0bd8:
  do {
    if (bones_local == (uint16_t *)0x0) {
      reorder(this);
      return;
    }
    bones_local = (uint16_t *)((long)bones_local + -1);
    if (bones_local == (uint16_t *)0x0) {
      bw.bone = (uint)(1.0 - bw.weight);
    }
    else {
      bw.bone = (uint)*_w;
      bw.weight = (float)bw.bone + bw.weight;
      _w = _w + 1;
    }
    pfVar2 = (float *)((long)weights_local + 2);
    _bone_weight<unsigned_int,_float>::_bone_weight
              ((_bone_weight<unsigned_int,_float> *)&it,(uint)*(ushort *)weights_local,
               (float)bw.bone);
    last = _svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>::begin
                     (&this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>);
    p_Var1 = _svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>::end
                       (&this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>);
    for (; weights_local = pfVar2, last != p_Var1; last = last + 1) {
      if (last->bone == (uint)it) goto LAB_001c0bd8;
    }
    _svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>::push_back
              (&this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>,
               (const_reference)&it);
  } while( true );
}

Assistant:

void _influence<Tb, Tw>::set(size_t num_bones, const uint16_t* bones, const float* weights)
{
	for (float sum = 0, w; num_bones;) {
		if (--num_bones == 0) {
			w = 1.f - sum;
		} else {
			w = *weights++;
			sum += w;
		}
		_bone_weight<Tb, Tw> bw(*bones++, w);
		for (typename _influence<Tb, Tw>::iterator it = _influence<Tb, Tw>::begin(),
				last = _influence<Tb, Tw>::end(); it != last; ++it) {
			if (it->bone == bw.bone) {
#if 0
				if (!equivalent<Tw>(w, 0)) {
					msg("bone%u, w=%f", bw.bone, w);
				}
				xr_assert(equivalent<Tw>(w, 0));
#endif
				goto skip;
			}
		}
		push_back(bw);
skip:;
	}
	reorder();
}